

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::request_vote(raft_server *this,bool force_vote)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  uint uVar4;
  element_type *log_idx;
  element_type *peVar5;
  ulong uVar6;
  undefined4 extraout_var;
  element_type *peVar7;
  undefined4 extraout_var_00;
  atomic<unsigned_long> *paVar8;
  element_type *peVar9;
  element_type *peVar10;
  undefined8 uVar11;
  byte in_SIL;
  raft_server *in_RDI;
  raft_server *in_stack_00000040;
  ptr<log_entry> fv_msg_le;
  ptr<force_vote_msg> fv_msg;
  ptr<req_msg> req;
  ptr<peer> pp;
  peer_itor it;
  memory_order __b;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffd48;
  peer *in_stack_fffffffffffffd50;
  undefined4 uVar12;
  int32 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  string *in_stack_fffffffffffffd60;
  element_type *in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  raft_server *in_stack_fffffffffffffd78;
  force_vote_msg *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  unsigned_long *in_stack_fffffffffffffd98;
  string local_190 [32];
  force_vote_msg local_170 [16];
  string local_160 [28];
  msg_type in_stack_fffffffffffffebc;
  string local_140 [39];
  undefined1 local_119;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ptr<req_msg> *in_stack_ffffffffffffff00;
  ptr<peer> *in_stack_ffffffffffffff08;
  peer *in_stack_ffffffffffffff10;
  undefined1 local_e0 [16];
  element_type *local_d0;
  int32 local_c8;
  undefined4 local_c4;
  element_type *local_c0;
  undefined4 local_a4;
  undefined1 local_a0 [88];
  string local_48 [64];
  undefined8 local_8;
  
  local_48[0x27] = (string)(in_SIL & 1);
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1c6967);
  srv_state::set_voted_for
            ((srv_state *)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
  ;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1c698e);
  log_idx = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c6996);
  peVar5 = std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffffd50);
  (*log_idx->_vptr_state_mgr[4])(log_idx,peVar5);
  in_RDI->votes_granted_ = in_RDI->votes_granted_ + 1;
  in_RDI->votes_responded_ = in_RDI->votes_responded_ + 1;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
  if (bVar1) {
    peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1c6a12);
    iVar3 = (*peVar10->_vptr_logger[7])();
    if (3 < iVar3) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1c6a38);
      uVar12 = (undefined4)((ulong)in_stack_fffffffffffffd50 >> 0x20);
      uVar4 = in_RDI->id_;
      std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1c6a5e);
      srv_role_to_string_abi_cxx11_((srv_role)((ulong)in_stack_fffffffffffffd88 >> 0x20));
      uVar11 = std::__cxx11::string::c_str();
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1c6a9e);
      uVar6 = srv_state::get_term((srv_state *)0x1c6aa6);
      peVar7 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1c6ac4);
      iVar3 = (*peVar7->_vptr_log_store[2])();
      peVar7 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1c6b01);
      (*peVar7->_vptr_log_store[2])();
      in_stack_fffffffffffffd48 =
           (unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
            *)term_for_log(in_RDI,(ulong)log_idx);
      in_stack_fffffffffffffd58 = in_RDI->my_priority_;
      in_stack_fffffffffffffd50 = (peer *)CONCAT44(uVar12,in_RDI->target_priority_);
      msg_if_given_abi_cxx11_
                ((char *)local_48,
                 "[VOTE INIT] my id %d, my role %s, term %lu, log idx %lu, log term %lu, priority (target %d / mine %d)\n"
                 ,(ulong)uVar4,uVar11,uVar6,CONCAT44(extraout_var,iVar3) + -1);
      (*peVar10->_vptr_logger[8])
                (peVar10,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_vote",0xe9,local_48);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string((string *)(local_a0 + 0x38));
    }
  }
  iVar3 = in_RDI->votes_granted_;
  iVar2 = get_quorum_for_election(in_stack_fffffffffffffd78);
  if (iVar2 < iVar3) {
    in_RDI->election_completed_ = true;
    become_leader(in_stack_00000040);
  }
  else {
    local_a0._24_8_ =
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::begin(in_stack_fffffffffffffd48);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_fffffffffffffd50,
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_fffffffffffffd48);
    while( true ) {
      local_a0._16_8_ =
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::end(in_stack_fffffffffffffd48);
      bVar1 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                          *)(local_a0 + 0x20),
                         (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                          *)(local_a0 + 0x10));
      if (!bVar1) break;
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x1c6ce5);
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd50,
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd48);
      bVar1 = is_regular_member((raft_server *)
                                CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                (ptr<peer> *)in_stack_fffffffffffffd50);
      if (bVar1) {
        std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1c6d69);
        local_c0 = (element_type *)srv_state::get_term((srv_state *)0x1c6d71);
        local_c4 = 1;
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1c6db7);
        local_c8 = peer::get_id((peer *)0x1c6dbf);
        peVar7 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1c6dea);
        (*peVar7->_vptr_log_store[2])();
        local_d0 = (element_type *)term_for_log(in_RDI,(ulong)log_idx);
        peVar7 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1c6e46);
        iVar3 = (*peVar7->_vptr_log_store[2])();
        local_e0._8_8_ = CONCAT44(extraout_var_00,iVar3) + -1;
        paVar8 = &in_RDI->quick_commit_index_;
        local_48[0x3c] = (string)0x5;
        local_48[0x3d] = (string)0x0;
        local_48[0x3e] = (string)0x0;
        local_48[0x3f] = (string)0x0;
        local_8 = paVar8;
        local_48._56_4_ = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_48._60_4_ - 1 < 2) {
          local_48._48_8_ = (paVar8->super___atomic_base<unsigned_long>)._M_i;
        }
        else if (local_48._60_4_ == 5) {
          local_48._48_8_ = (paVar8->super___atomic_base<unsigned_long>)._M_i;
        }
        else {
          local_48._48_8_ = (paVar8->super___atomic_base<unsigned_long>)._M_i;
        }
        local_e0[0] = local_48[0x30];
        local_e0[1] = local_48[0x31];
        local_e0[2] = local_48[0x32];
        local_e0[3] = local_48[0x33];
        local_e0[4] = local_48[0x34];
        local_e0[5] = local_48[0x35];
        local_e0[6] = local_48[0x36];
        local_e0[7] = local_48[0x37];
        in_stack_fffffffffffffd50 = (peer *)local_e0;
        in_stack_fffffffffffffd48 =
             (unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
              *)(local_e0 + 8);
        cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long>
                  ((unsigned_long *)in_stack_fffffffffffffd78,
                   (msg_type *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (int *)in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd98);
        if (((byte)local_48[0x27] & 1) != 0) {
          cs_new<nuraft::force_vote_msg>();
          in_stack_fffffffffffffefc = 0;
          std::__shared_ptr_access<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c6fb0);
          force_vote_msg::serialize(in_stack_fffffffffffffd88);
          local_119 = 0xe7;
          cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                    ((int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd50,
                     (log_val_type *)in_stack_fffffffffffffd48);
          std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1c6ffe);
          peVar9 = std::
                   __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1c700b);
          req_msg::log_entries(peVar9);
          std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       *)in_stack_fffffffffffffd60,
                      (value_type *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
          std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1c703b)
          ;
          std::shared_ptr<nuraft::force_vote_msg>::~shared_ptr
                    ((shared_ptr<nuraft::force_vote_msg> *)0x1c7048);
        }
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
        if (bVar1) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1c7103);
          iVar3 = (*peVar10->_vptr_logger[7])();
          if (4 < iVar3) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1c7136);
            peVar9 = std::
                     __shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1c7148);
            msg_base::get_type(&peVar9->super_msg_base);
            msg_type_to_string_abi_cxx11_(in_stack_fffffffffffffebc);
            uVar11 = std::__cxx11::string::c_str();
            std::__detail::
            _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
            ::operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                          *)0x1c7188);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c7194);
            uVar4 = peer::get_id((peer *)0x1c719c);
            std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1c71b6);
            in_stack_fffffffffffffd98 = (unsigned_long *)srv_state::get_term((srv_state *)0x1c71be);
            msg_if_given_abi_cxx11_
                      ((char *)local_140,"send %s to server %d with term %lu",uVar11,(ulong)uVar4,
                       in_stack_fffffffffffffd98);
            (*peVar10->_vptr_logger[8])
                      (peVar10,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"request_vote",0x10e,local_140);
            std::__cxx11::string::~string(local_140);
            std::__cxx11::string::~string(local_160);
          }
        }
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1c728e);
        in_stack_fffffffffffffd97 = peer::make_busy(in_stack_fffffffffffffd50);
        if ((bool)in_stack_fffffffffffffd97) {
          in_stack_fffffffffffffd78 = (raft_server *)local_a0;
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1c72bb);
          in_stack_fffffffffffffd88 = local_170;
          std::shared_ptr<nuraft::peer>::shared_ptr
                    ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd50,
                     (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd48);
          peer::send_req(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                         in_stack_ffffffffffffff00,
                         (rpc_handler *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1c730c);
        }
        else {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->l_);
          if (bVar1) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1c7368);
            in_stack_fffffffffffffd74 = (*peVar10->_vptr_logger[7])();
            if (2 < in_stack_fffffffffffffd74) {
              in_stack_fffffffffffffd68 =
                   std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1c739b);
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1c73ad);
              in_stack_fffffffffffffd70 = peer::get_id((peer *)0x1c73b5);
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1c73c8);
              in_stack_fffffffffffffd60 = peer::get_endpoint_abi_cxx11_((peer *)0x1c73d0);
              uVar11 = std::__cxx11::string::c_str();
              msg_if_given_abi_cxx11_
                        ((char *)local_190,"failed to send vote request: peer %d (%s) is busy",
                         (ulong)in_stack_fffffffffffffd70,uVar11);
              (*in_stack_fffffffffffffd68->_vptr_logger[8])
                        (in_stack_fffffffffffffd68,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"request_vote",0x113,local_190);
              std::__cxx11::string::~string(local_190);
            }
          }
        }
        std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x1c7472);
        local_a4 = 0;
      }
      else {
        local_a4 = 4;
      }
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1c748a);
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)in_stack_fffffffffffffd50);
    }
  }
  return;
}

Assistant:

void raft_server::request_vote(bool force_vote) {
    state_->set_voted_for(id_);
    ctx_->state_mgr_->save_state(*state_);
    votes_granted_ += 1;
    votes_responded_ += 1;
    p_in("[VOTE INIT] my id %d, my role %s, term %" PRIu64 ", log idx %" PRIu64 ", "
         "log term %" PRIu64 ", priority (target %d / mine %d)\n",
         id_, srv_role_to_string(role_).c_str(),
         state_->get_term(), log_store_->next_slot() - 1,
         term_for_log(log_store_->next_slot() - 1),
         target_priority_, my_priority_);

    // is this the only server?
    if (votes_granted_ > get_quorum_for_election()) {
        election_completed_ = true;
        become_leader();
        return;
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) {
            // Do not send voting request to learner.
            continue;
        }
        ptr<req_msg> req = cs_new<req_msg>
                           ( state_->get_term(),
                             msg_type::request_vote_request,
                             id_,
                             pp->get_id(),
                             term_for_log(log_store_->next_slot() - 1),
                             log_store_->next_slot() - 1,
                             quick_commit_index_.load() );
        if (force_vote) {
            // Add a special log entry to let receivers ignore the priority.

            // Force vote message, and wrap it using log_entry.
            ptr<force_vote_msg> fv_msg = cs_new<force_vote_msg>();
            ptr<log_entry> fv_msg_le =
                cs_new<log_entry>(0, fv_msg->serialize(), log_val_type::custom);

            // Ship it.
            req->log_entries().push_back(fv_msg_le);
        }
        p_db( "send %s to server %d with term %" PRIu64 "",
              msg_type_to_string(req->get_type()).c_str(),
              it->second->get_id(),
              state_->get_term() );
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_wn("failed to send vote request: peer %d (%s) is busy",
                 pp->get_id(), pp->get_endpoint().c_str());
        }
    }
}